

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O0

QByteArray * __thiscall QRestReply::readBody(QRestReply *this)

{
  bool bVar1;
  QByteArray *in_RDI;
  
  bVar1 = QPointer::operator_cast_to_bool((QPointer<QNetworkReply> *)0x333b1d);
  if (bVar1) {
    QPointer<QNetworkReply>::operator->((QPointer<QNetworkReply> *)0x333b2d);
    QIODevice::readAll();
  }
  else {
    QByteArray::QByteArray((QByteArray *)0x333b44);
  }
  return in_RDI;
}

Assistant:

QByteArray QRestReply::readBody()
{
    return wrapped ? wrapped->readAll() : QByteArray{};
}